

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
::Intrusive_list_column
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
           *this,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                 *column,Column_settings *colSettings)

{
  Entry_constructor *pEVar1;
  Column_settings *local_68;
  Field_operators *local_58;
  Delete_disposer local_40 [3];
  New_cloner local_28;
  Column_settings *local_20;
  Column_settings *colSettings_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  *column_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  local_20 = colSettings;
  colSettings_local = (Column_settings *)column;
  column_local = this;
  Dummy_row_access::Dummy_row_access((Dummy_row_access *)this);
  Column_dimension_holder<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  ::Column_dimension_holder
            (&this->super_Column_dimension_option,
             (Column_dimension_holder<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
              *)colSettings_local);
  if (local_20 == (Column_settings *)0x0) {
    local_58 = (Field_operators *)
               (colSettings_local->entryConstructor).entryPool_.
               super_pool<boost::default_user_allocator_malloc_free>.list.ptr;
  }
  else {
    local_58 = (Field_operators *)0x0;
  }
  this->operators_ = local_58;
  if (local_20 == (Column_settings *)0x0) {
    local_68 = (Column_settings *)
               (colSettings_local->entryConstructor).entryPool_.
               super_pool<boost::default_user_allocator_malloc_free>.list.sz;
  }
  else {
    local_68 = local_20;
  }
  this->entryPool_ = &local_68->entryConstructor;
  boost::intrusive::
  list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::list(&this->column_);
  pEVar1 = &colSettings_local->entryConstructor;
  New_cloner::New_cloner(&local_28,this->entryPool_);
  Delete_disposer::Delete_disposer(local_40,this);
  boost::intrusive::
  list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>::Matrix_column_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>>>>
  ::
  clone_from<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>::New_cloner,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>::Delete_disposer>
            ((list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>::Matrix_column_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>>>>
              *)&this->column_,
             (list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
              *)&(pEVar1->entryPool_).super_pool<boost::default_user_allocator_malloc_free>.
                 requested_size,local_28,local_40[0]);
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(const Intrusive_list_column& column,
                                                                   Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor)),
      column_()
{
  static_assert(!Master_matrix::Option_list::has_row_access,
                "Simple copy constructor not available when row access option enabled. Please specify the new column "
                "index and the row container.");
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  column_.clone_from(column.column_, New_cloner(entryPool_), Delete_disposer(this));
}